

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QList<QSize>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QSize **debug;
  long in_FS_OFFSET;
  QList<QSize> local_28;
  
  local_28.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)dbg->stream;
  ((Stream *)local_28.d.d)->ref = ((Stream *)local_28.d.d)->ref + 1;
  debug = &local_28.d.ptr;
  ::operator<<((QDebug)debug,&local_28);
  QDebug::~QDebug((QDebug *)debug);
  QDebug::~QDebug((QDebug *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28.d.size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }